

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O0

void __thiscall r_exec::_Mem::inject_perf_stats(_Mem *this)

{
  Code *object;
  uint64_t after;
  Code *object_00;
  View *this_00;
  uint64_t reduction_job_avg_latency;
  View *view;
  Code *f_perf;
  uint64_t now;
  Code *perf;
  int64_t d_time_job_avg_latency;
  int64_t d_reduction_job_avg_latency;
  _Mem *this_local;
  
  std::mutex::lock(&this->m_reductionJobMutex);
  std::mutex::lock(&this->m_timeJobMutex);
  if (this->reduction_job_count == 0) {
    d_time_job_avg_latency = 0;
    this->reduction_job_avg_latency = 0;
  }
  else {
    this->reduction_job_avg_latency = this->reduction_job_avg_latency / this->reduction_job_count;
    d_time_job_avg_latency = this->reduction_job_avg_latency - this->_reduction_job_avg_latency;
  }
  if (this->time_job_count == 0) {
    perf = (Code *)0x0;
    this->time_job_avg_latency = 0;
  }
  else {
    this->time_job_avg_latency = this->time_job_avg_latency / this->time_job_count;
    perf = (Code *)(this->time_job_avg_latency - this->_time_job_avg_latency);
  }
  object = (Code *)operator_new(0x150);
  reduction_job_avg_latency = this->reduction_job_avg_latency;
  Perf::Perf((Perf *)object,reduction_job_avg_latency,d_time_job_avg_latency,
             this->time_job_avg_latency,(int64_t)perf);
  this->time_job_count = 0;
  this->reduction_job_count = 0;
  this->_reduction_job_avg_latency = this->reduction_job_avg_latency;
  this->_time_job_avg_latency = this->time_job_avg_latency;
  std::mutex::unlock(&this->m_timeJobMutex);
  std::mutex::unlock(&this->m_reductionJobMutex);
  after = (*Now)();
  object_00 = (Code *)Fact::operator_new((Fact *)0x150,reduction_job_avg_latency);
  Fact::Fact((Fact *)object_00,object,after,after + this->perf_sampling_period,1.0,1.0);
  this_00 = (View *)operator_new(0x100);
  View::View(this_00,SYNC_ONCE,after,1.0,1,this->_stdin,(Code *)0x0,object_00);
  inject(this,this_00);
  return;
}

Assistant:

void _Mem::inject_perf_stats()
{
    m_reductionJobMutex.lock();
    m_timeJobMutex.lock();
    int64_t d_reduction_job_avg_latency;

    if (reduction_job_count > 0) {
        reduction_job_avg_latency /= reduction_job_count;
        d_reduction_job_avg_latency = reduction_job_avg_latency - _reduction_job_avg_latency;
    } else {
        reduction_job_avg_latency = d_reduction_job_avg_latency = 0;
    }

    int64_t d_time_job_avg_latency;

    if (time_job_count > 0) {
        time_job_avg_latency /= time_job_count;
        d_time_job_avg_latency = time_job_avg_latency - _time_job_avg_latency;
    } else {
        time_job_avg_latency = d_time_job_avg_latency = 0;
    }

    Code *perf = new Perf(reduction_job_avg_latency, d_reduction_job_avg_latency, time_job_avg_latency, d_time_job_avg_latency);
    // reset stats.
    reduction_job_count = time_job_count = 0;
    _reduction_job_avg_latency = reduction_job_avg_latency;
    _time_job_avg_latency = time_job_avg_latency;
    m_timeJobMutex.unlock();
    m_reductionJobMutex.unlock();
    // inject f->perf in stdin.
    uint64_t now = Now();
    Code *f_perf = new Fact(perf, now, now + perf_sampling_period, 1, 1);
    View *view = new View(View::SYNC_ONCE, now, 1, 1, _stdin, nullptr, f_perf); // sync front, sln=1, res=1.
    inject(view);
}